

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRandomFragmentOpTests.cpp
# Opt level: O3

void deqp::gles3::Functional::translateStencilState(StencilState *src,StencilState *dst)

{
  deUint32 dVar1;
  TestFunc TVar2;
  StencilOp SVar3;
  
  TVar2 = sglr::rr_util::mapGLTestFunc(src->function);
  dst->func = TVar2;
  dVar1 = src->compareMask;
  dst->ref = src->reference;
  dst->compMask = dVar1;
  SVar3 = sglr::rr_util::mapGLStencilOp(src->stencilFailOp);
  dst->sFail = SVar3;
  SVar3 = sglr::rr_util::mapGLStencilOp(src->depthFailOp);
  dst->dpFail = SVar3;
  SVar3 = sglr::rr_util::mapGLStencilOp(src->depthPassOp);
  dst->dpPass = SVar3;
  dst->writeMask = src->writeMask;
  return;
}

Assistant:

void translateStencilState (const StencilState& src, rr::StencilState& dst)
{
	dst.func		= sglr::rr_util::mapGLTestFunc(src.function);
	dst.ref			= src.reference;
	dst.compMask	= src.compareMask;
	dst.sFail		= sglr::rr_util::mapGLStencilOp(src.stencilFailOp);
	dst.dpFail		= sglr::rr_util::mapGLStencilOp(src.depthFailOp);
	dst.dpPass		= sglr::rr_util::mapGLStencilOp(src.depthPassOp);
	dst.writeMask	= src.writeMask;
}